

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_program_binary(NegativeTestContext *ctx)

{
  undefined *puVar1;
  deUint64 dVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  MessageBuilder local_a60;
  MessageBuilder local_8e0;
  allocator<char> local_759;
  string local_758;
  MessageBuilder local_738;
  MessageBuilder local_5b8;
  allocator<char> local_431;
  string local_430;
  GLint local_410;
  GLint local_40c;
  GLint linkStatus;
  GLint bufSize;
  GLint binaryPtr;
  GLsizei binaryLength;
  GLenum binaryFormat;
  allocator<char> local_3d1;
  string local_3d0;
  ProgramSources local_3b0;
  undefined1 local_2e0 [8];
  ShaderProgram programInvalid;
  string local_208;
  allocator<char> local_1d1;
  string local_1d0;
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram program;
  NegativeTestContext *ctx_local;
  
  program.m_program.m_info.linkTimeUs = (deUint64)ctx;
  pRVar4 = NegativeTestContext::getRenderContext(ctx);
  puVar1 = vertexShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,puVar1,&local_1d1);
  puVar1 = fragmentShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,puVar1,
             (allocator<char> *)((long)&programInvalid.m_program.m_info.linkTimeUs + 7));
  glu::makeVtxFragSources(&local_1b0,&local_1d0,&local_208);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,pRVar4,&local_1b0);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&programInvalid.m_program.m_info.linkTimeUs + 7));
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  pRVar4 = NegativeTestContext::getRenderContext
                     ((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  puVar1 = vertexShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,puVar1,&local_3d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&binaryFormat,"",(allocator<char> *)((long)&binaryLength + 3));
  glu::makeVtxFragSources(&local_3b0,&local_3d0,(string *)&binaryFormat);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_2e0,pRVar4,&local_3b0);
  glu::ProgramSources::~ProgramSources(&local_3b0);
  std::__cxx11::string::~string((string *)&binaryFormat);
  std::allocator<char>::~allocator((allocator<char> *)((long)&binaryLength + 3));
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  dVar2 = program.m_program.m_info.linkTimeUs;
  binaryPtr = -1;
  bufSize = -1;
  linkStatus = -1;
  local_40c = -1;
  local_410 = -1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,
             "GL_INVALID_OPERATION is generated if bufSize is less than the size of GL_PROGRAM_BINARY_LENGTH for program."
             ,&local_431);
  NegativeTestContext::beginSection((NegativeTestContext *)dVar2,&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glGetProgramiv((CallLogWrapper *)dVar2,dVar3,0x8741,&local_40c);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glGetProgramiv((CallLogWrapper *)dVar2,dVar3,0x8b82,&local_410);
  pTVar5 = glu::CallLogWrapper::getLog((CallLogWrapper *)program.m_program.m_info.linkTimeUs);
  tcu::TestLog::operator<<(&local_5b8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_5b8,(char (*) [31])"// GL_PROGRAM_BINARY_LENGTH = ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_40c);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_5b8);
  pTVar5 = glu::CallLogWrapper::getLog((CallLogWrapper *)program.m_program.m_info.linkTimeUs);
  tcu::TestLog::operator<<(&local_738,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_738,(char (*) [21])"// GL_LINK_STATUS = ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_410);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_738);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glGetProgramBinary
            ((CallLogWrapper *)dVar2,dVar3,0,&bufSize,(GLenum *)&binaryPtr,&linkStatus);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar2 = program.m_program.m_info.linkTimeUs;
  if (0 < local_40c) {
    dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    glu::CallLogWrapper::glGetProgramBinary
              ((CallLogWrapper *)dVar2,dVar3,local_40c + -1,&bufSize,(GLenum *)&binaryPtr,
               &linkStatus);
    NegativeTestContext::expectError
              ((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502);
  }
  NegativeTestContext::endSection((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  dVar2 = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_758,
             "GL_INVALID_OPERATION is generated if GL_LINK_STATUS for the program object is false.",
             &local_759);
  NegativeTestContext::beginSection((NegativeTestContext *)dVar2,&local_758);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator(&local_759);
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2e0);
  glu::CallLogWrapper::glGetProgramiv((CallLogWrapper *)dVar2,dVar3,0x8741,&local_40c);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2e0);
  glu::CallLogWrapper::glGetProgramiv((CallLogWrapper *)dVar2,dVar3,0x8b82,&local_410);
  pTVar5 = glu::CallLogWrapper::getLog((CallLogWrapper *)program.m_program.m_info.linkTimeUs);
  tcu::TestLog::operator<<(&local_8e0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_8e0,(char (*) [31])"// GL_PROGRAM_BINARY_LENGTH = ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_40c);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_8e0);
  pTVar5 = glu::CallLogWrapper::getLog((CallLogWrapper *)program.m_program.m_info.linkTimeUs);
  tcu::TestLog::operator<<(&local_a60,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_a60,(char (*) [21])"// GL_LINK_STATUS = ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_410);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_a60);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2e0);
  glu::CallLogWrapper::glGetProgramBinary
            ((CallLogWrapper *)dVar2,dVar3,local_40c,&bufSize,(GLenum *)&binaryPtr,&linkStatus);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  NegativeTestContext::endSection((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_2e0);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
  return;
}

Assistant:

void get_program_binary (NegativeTestContext& ctx)
{
	glu::ShaderProgram				program			(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));
	glu::ShaderProgram				programInvalid	(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, ""));
	GLenum							binaryFormat	= -1;
	GLsizei							binaryLength	= -1;
	GLint							binaryPtr		= -1;
	GLint							bufSize			= -1;
	GLint							linkStatus		= -1;

	ctx.beginSection("GL_INVALID_OPERATION is generated if bufSize is less than the size of GL_PROGRAM_BINARY_LENGTH for program.");
	ctx.glGetProgramiv		(program.getProgram(), GL_PROGRAM_BINARY_LENGTH,	&bufSize);
	ctx.expectError		(GL_NO_ERROR);
	ctx.glGetProgramiv		(program.getProgram(), GL_LINK_STATUS,				&linkStatus);
	ctx.getLog() << TestLog::Message << "// GL_PROGRAM_BINARY_LENGTH = " << bufSize << TestLog::EndMessage;
	ctx.getLog() << TestLog::Message << "// GL_LINK_STATUS = " << linkStatus << TestLog::EndMessage;
	ctx.expectError		(GL_NO_ERROR);

	ctx.glGetProgramBinary	(program.getProgram(), 0, &binaryLength, &binaryFormat, &binaryPtr);
	ctx.expectError		(GL_INVALID_OPERATION);
	if (bufSize > 0)
	{
		ctx.glGetProgramBinary	(program.getProgram(), bufSize-1, &binaryLength, &binaryFormat, &binaryPtr);
		ctx.expectError		(GL_INVALID_OPERATION);
	}
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if GL_LINK_STATUS for the program object is false.");
	ctx.glGetProgramiv		(programInvalid.getProgram(), GL_PROGRAM_BINARY_LENGTH,	&bufSize);
	ctx.expectError		(GL_NO_ERROR);
	ctx.glGetProgramiv		(programInvalid.getProgram(), GL_LINK_STATUS,			&linkStatus);
	ctx.getLog() << TestLog::Message << "// GL_PROGRAM_BINARY_LENGTH = " << bufSize << TestLog::EndMessage;
	ctx.getLog() << TestLog::Message << "// GL_LINK_STATUS = " << linkStatus << TestLog::EndMessage;
	ctx.expectError		(GL_NO_ERROR);

	ctx.glGetProgramBinary	(programInvalid.getProgram(), bufSize, &binaryLength, &binaryFormat, &binaryPtr);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.endSection();
}